

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::IFF_PDU::SetLayers
          (IFF_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
          *L)

{
  bool bVar1;
  KUINT16 KVar2;
  reference this_00;
  LayerHeader *this_01;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
  *L_local;
  IFF_PDU *this_local;
  
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
  ::operator=(&this->m_vLayers,L);
  (this->super_Header).super_Header6.m_ui16PDULength = 0x3c;
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
            ::begin(L);
  local_28._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::LayerHeader> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
       ::end(L);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>_>
              ::operator*(&citrEnd);
    this_01 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>::operator->(this_00);
    KVar2 = DATA_TYPE::LayerHeader::GetLayerLength(this_01);
    (this->super_Header).super_Header6.m_ui16PDULength =
         (this->super_Header).super_Header6.m_ui16PDULength + KVar2;
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void IFF_PDU::SetLayers( const vector<LyrHdrPtr> & L )
{
	m_vLayers = L;
	m_ui16PDULength = IFF_PDU_SIZE;
	vector<LyrHdrPtr>::const_iterator citr = L.begin();
	vector<LyrHdrPtr>::const_iterator citrEnd = L.end();
	for( ; citr != citrEnd; ++citr )
	{
		m_ui16PDULength += ( *citr )->GetLayerLength();
	}
}